

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_window_update(ZSTD_window_t *window,void *src,size_t srcSize,int forceNonContiguous)

{
  U32 UVar1;
  U32 UVar2;
  uint uVar3;
  BYTE *pBVar4;
  uint uVar5;
  ulong uVar6;
  BYTE *pBVar7;
  
  if (srcSize == 0) {
    UVar2 = 1;
  }
  else {
    pBVar7 = window->base;
    if (pBVar7 == (BYTE *)0x0) {
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d8,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if (window->dictBase == (BYTE *)0x0) {
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d9,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if (forceNonContiguous == 0 && window->nextSrc == (BYTE *)src) {
      uVar6 = (ulong)window->dictLimit;
      UVar2 = 1;
      pBVar7 = window->dictBase;
      uVar3 = window->lowLimit;
    }
    else {
      uVar6 = (long)window->nextSrc - (long)pBVar7;
      uVar3 = window->dictLimit;
      window->lowLimit = uVar3;
      if (uVar6 >> 0x20 != 0) {
        __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x48e0,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
      }
      uVar5 = (uint)uVar6;
      window->dictLimit = uVar5;
      window->dictBase = pBVar7;
      window->base = (BYTE *)((long)src - uVar6);
      UVar2 = 0;
      if (uVar5 - uVar3 < 8) {
        window->lowLimit = uVar5;
        uVar3 = uVar5;
      }
    }
    pBVar4 = (BYTE *)(srcSize + (long)src);
    window->nextSrc = pBVar4;
    if ((pBVar7 + uVar3 < pBVar4) && (src < pBVar7 + (uVar6 & 0xffffffff))) {
      UVar1 = (U32)((long)pBVar4 - (long)pBVar7);
      if ((long)(uVar6 & 0xffffffff) < (long)pBVar4 - (long)pBVar7) {
        UVar1 = (U32)uVar6;
      }
      window->lowLimit = UVar1;
    }
  }
  return UVar2;
}

Assistant:

MEM_STATIC U32 ZSTD_window_update(ZSTD_window_t* window,
                                  void const* src, size_t srcSize,
                                  int forceNonContiguous)
{
    BYTE const* const ip = (BYTE const*)src;
    U32 contiguous = 1;
    DEBUGLOG(5, "ZSTD_window_update");
    if (srcSize == 0)
        return contiguous;
    assert(window->base != NULL);
    assert(window->dictBase != NULL);
    /* Check if blocks follow each other */
    if (src != window->nextSrc || forceNonContiguous) {
        /* not contiguous */
        size_t const distanceFromBase = (size_t)(window->nextSrc - window->base);
        DEBUGLOG(5, "Non contiguous blocks, new segment starts at %u", window->dictLimit);
        window->lowLimit = window->dictLimit;
        assert(distanceFromBase == (size_t)(U32)distanceFromBase);  /* should never overflow */
        window->dictLimit = (U32)distanceFromBase;
        window->dictBase = window->base;
        window->base = ip - distanceFromBase;
        /* ms->nextToUpdate = window->dictLimit; */
        if (window->dictLimit - window->lowLimit < HASH_READ_SIZE) window->lowLimit = window->dictLimit;   /* too small extDict */
        contiguous = 0;
    }
    window->nextSrc = ip + srcSize;
    /* if input and dictionary overlap : reduce dictionary (area presumed modified by input) */
    if ( (ip+srcSize > window->dictBase + window->lowLimit)
       & (ip < window->dictBase + window->dictLimit)) {
        ptrdiff_t const highInputIdx = (ip + srcSize) - window->dictBase;
        U32 const lowLimitMax = (highInputIdx > (ptrdiff_t)window->dictLimit) ? window->dictLimit : (U32)highInputIdx;
        window->lowLimit = lowLimitMax;
        DEBUGLOG(5, "Overlapping extDict and input : new lowLimit = %u", window->lowLimit);
    }
    return contiguous;
}